

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error split_sdf_conic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  SDF_Edge_ *local_98;
  SDF_Edge *right;
  SDF_Edge *left;
  FT_26D6_Vec cpos [5];
  FT_Error local_2c;
  FT_Error error;
  SDF_Edge **out_local;
  FT_UInt max_splits_local;
  FT_26D6_Vec *control_points_local;
  FT_Memory memory_local;
  
  if ((memory == (FT_Memory)0x0) || (out == (SDF_Edge **)0x0)) {
    local_2c = 6;
  }
  else {
    left = (SDF_Edge *)control_points->x;
    cpos[0].x = control_points->y;
    cpos[0].y = control_points[1].x;
    cpos[1].x = control_points[1].y;
    cpos[1].y = control_points[2].x;
    cpos[2].x = control_points[2].y;
    split_conic((FT_26D6_Vec *)&left);
    if (max_splits < 3) {
      local_2c = sdf_edge_new(memory,&right);
      if ((local_2c == 0) && (local_2c = sdf_edge_new(memory,&local_98), local_2c == 0)) {
        (right->start_pos).x = (FT_Pos)left;
        (right->start_pos).y = cpos[0].x;
        (right->end_pos).x = cpos[1].y;
        (right->end_pos).y = cpos[2].x;
        right->edge_type = SDF_EDGE_LINE;
        (local_98->start_pos).x = cpos[1].y;
        (local_98->start_pos).y = cpos[2].x;
        (local_98->end_pos).x = cpos[3].y;
        (local_98->end_pos).y = cpos[4].x;
        local_98->edge_type = SDF_EDGE_LINE;
        right->next = local_98;
        local_98->next = *out;
        *out = right;
      }
    }
    else {
      local_2c = split_sdf_conic(memory,(FT_26D6_Vec *)&left,max_splits >> 1,out);
      if (local_2c == 0) {
        local_2c = split_sdf_conic(memory,(FT_26D6_Vec *)&cpos[1].y,max_splits >> 1,out);
      }
    }
  }
  return local_2c;
}

Assistant:

static FT_Error
  split_sdf_conic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error     error = FT_Err_Ok;
    FT_26D6_Vec  cpos[5];
    SDF_Edge*    left,*  right;


    if ( !memory || !out  )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split conic outline */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];

    split_conic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_conic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_conic( memory, &cpos[2], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left ) );
    FT_CALL( sdf_edge_new( memory, &right ) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[2];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[2];
    right->end_pos   = cpos[4];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }